

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
nlohmann::json_abi_v3_11_3::detail::
concat<std::__cxx11::string,char_const(&)[29],std::__cxx11::string,char_const(&)[5],std::__cxx11::string>
          (char (*args) [29],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [5],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  char (*arg) [29];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar1;
  
  uVar1 = 0;
  rest = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffc0);
  arg = (char (*) [29])
        concat_length<std::__cxx11::string,char[5],std::__cxx11::string>
                  ((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(char (*) [5])rest,
                   in_RDI);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[29],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (in_stack_ffffffffffffffc0,arg,rest,(char (*) [5])in_RDI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x21cf90);
  return rest;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}